

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::end
          (iterator *__return_storage_ptr__,IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  IEnumerable<int_&> IStack_28;
  
  IEnumerable<int_&>::IEnumerable(&IStack_28,&this->source);
  IEnumerable<int_&>::IEnumerable(&__return_storage_ptr__->source,&IStack_28);
  __return_storage_ptr__->valid = false;
  IEnumerable<int_&>::~IEnumerable(&IStack_28);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }